

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

size_t wallet::wallet_tests::CalculateNestedKeyhashInputSize(bool use_max_sig)

{
  uint uVar1;
  undefined8 data;
  bool bVar2;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar3;
  BaseSignatureCreator **ppBVar4;
  uint uVar5;
  size_t sVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar7;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  Span<unsigned_char> output_00;
  CKey key;
  CTxIn tx_in;
  SignatureData sig_data;
  FillableSigningProvider keystore;
  CScript script_pubkey;
  uint160 script_id;
  CScript inner_script;
  uint160 key_hash;
  CPubKey pubkey;
  allocator_type local_589;
  undefined1 local_588 [8];
  secure_unique_ptr<KeyType> local_580;
  CTxIn local_578;
  undefined1 local_508 [32];
  uchar local_4e8 [8];
  undefined1 auStack_4e0 [32];
  undefined1 auStack_4c0 [128];
  _Rb_tree_node_base local_440;
  size_t local_420;
  bool local_3b0;
  _Rb_tree_node_base local_3a0;
  size_t local_380;
  _Rb_tree_node_base local_370;
  size_t local_350;
  pointer puStack_348;
  pointer local_340;
  pointer puStack_338;
  _Rb_tree_node_base local_328;
  size_t local_308;
  _Rb_tree_node_base local_2f8;
  size_t local_2d8;
  _Rb_tree_node_base local_2c8;
  size_t local_2a8;
  pointer pCStack_2a0;
  pointer local_298;
  pointer pCStack_290;
  pointer local_288;
  pointer pCStack_280;
  pointer local_278;
  uchar auStack_270 [64];
  _Rb_tree_node_base local_230;
  size_t local_210;
  _Rb_tree_node_base local_200;
  size_t local_1e0;
  _Rb_tree_node_base local_1d0;
  size_t local_1b0;
  _Rb_tree_node_base local_1a0;
  size_t local_180;
  FillableSigningProvider local_178;
  direct_or_indirect local_e8;
  uint local_cc;
  uchar local_c8 [32];
  direct_or_indirect local_a8;
  uint local_8c;
  uchar local_88 [31];
  CPubKey local_69;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81((CKey *)local_588,0));
  CKey::GetPubKey(&local_69,(CKey *)local_588);
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  local_88[0x10] = '\0';
  local_88[0x11] = '\0';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  auStack_4c0[8] = '\0';
  auStack_4c0[9] = '\0';
  auStack_4c0[10] = '\0';
  auStack_4c0[0xb] = '\0';
  auStack_4c0[0xc] = '\0';
  auStack_4c0[0xd] = '\0';
  auStack_4c0[0xe] = '\0';
  auStack_4c0[0xf] = '\0';
  auStack_4c0[0x10] = '\0';
  auStack_4c0[0x11] = '\0';
  auStack_4c0[0x12] = '\0';
  auStack_4c0[0x13] = '\0';
  auStack_4c0[0x14] = '\0';
  auStack_4c0[0x15] = '\0';
  auStack_4c0[0x16] = '\0';
  auStack_4c0[0x17] = '\0';
  auStack_4e0._24_8_ = 0;
  auStack_4c0._0_8_ = (char *)0x0;
  auStack_4e0[8] = '\0';
  auStack_4e0[9] = '\0';
  auStack_4e0[10] = '\0';
  auStack_4e0[0xb] = '\0';
  auStack_4e0[0xc] = '\0';
  auStack_4e0[0xd] = '\0';
  auStack_4e0[0xe] = '\0';
  auStack_4e0[0xf] = '\0';
  auStack_4e0[0x10] = '\0';
  auStack_4e0[0x11] = '\0';
  auStack_4e0[0x12] = '\0';
  auStack_4e0[0x13] = '\0';
  auStack_4e0[0x14] = '\0';
  auStack_4e0[0x15] = '\0';
  auStack_4e0[0x16] = '\0';
  auStack_4e0[0x17] = '\0';
  local_4e8[0] = '\0';
  local_4e8[1] = '\0';
  local_4e8[2] = '\0';
  local_4e8[3] = '\0';
  local_4e8[4] = '\0';
  local_4e8[5] = '\0';
  local_4e8[6] = '\0';
  local_4e8[7] = '\0';
  auStack_4e0._0_8_ = (char *)0x0;
  local_508._16_4_ = 0;
  local_508._20_4_ = 0;
  local_508._24_8_ = 0;
  local_508._0_8_ = (char *)0x0;
  local_508._8_4_ = 0;
  local_508._12_4_ = 0;
  auStack_4c0._24_8_ = 0;
  CSHA256::CSHA256((CSHA256 *)local_508);
  sVar6 = 0x21;
  if ((local_69.vch[0] & 0xfe) != 2) {
    if ((byte)(local_69.vch[0] - 4) < 4) {
      sVar6 = (&DAT_00e8a840)[(byte)(local_69.vch[0] - 4)];
    }
    else {
      sVar6 = 0;
    }
  }
  CSHA256::Write((CSHA256 *)local_508,local_69.vch,sVar6);
  output.m_size = 0x14;
  output.m_data = local_88;
  CHash160::Finalize((CHash160 *)local_508,output);
  local_508._16_4_ = 0;
  local_508._20_4_ = 0;
  local_508._24_8_ = 0;
  local_508._0_8_ = (char *)0x0;
  local_508._8_4_ = 0;
  local_508._12_4_ = 0;
  local_178.super_SigningProvider._vptr_SigningProvider =
       local_178.super_SigningProvider._vptr_SigningProvider & 0xffffffffffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_508,(iterator)local_508,
             (uchar *)&local_178);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_178,local_88,
             local_88 + 0x14,(allocator_type *)&local_578);
  ppVar3 = &CScript::operator<<((CScript *)local_508,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178)
            ->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_a8.indirect_contents,ppVar3)
  ;
  if (local_178.super_SigningProvider._vptr_SigningProvider != (_func_int **)0x0) {
    operator_delete(local_178.super_SigningProvider._vptr_SigningProvider,
                    CONCAT44(local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                             local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                            ) - (long)local_178.super_SigningProvider._vptr_SigningProvider);
  }
  if (0x1c < (uint)local_508._28_4_) {
    free((void *)local_508._0_8_);
  }
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = '\0';
  local_c8[6] = '\0';
  local_c8[7] = '\0';
  local_c8[8] = '\0';
  local_c8[9] = '\0';
  local_c8[10] = '\0';
  local_c8[0xb] = '\0';
  local_c8[0xc] = '\0';
  local_c8[0xd] = '\0';
  local_c8[0xe] = '\0';
  local_c8[0xf] = '\0';
  local_c8[0x10] = '\0';
  local_c8[0x11] = '\0';
  local_c8[0x12] = '\0';
  local_c8[0x13] = '\0';
  auStack_4c0[8] = '\0';
  auStack_4c0[9] = '\0';
  auStack_4c0[10] = '\0';
  auStack_4c0[0xb] = '\0';
  auStack_4c0[0xc] = '\0';
  auStack_4c0[0xd] = '\0';
  auStack_4c0[0xe] = '\0';
  auStack_4c0[0xf] = '\0';
  auStack_4c0[0x10] = '\0';
  auStack_4c0[0x11] = '\0';
  auStack_4c0[0x12] = '\0';
  auStack_4c0[0x13] = '\0';
  auStack_4c0[0x14] = '\0';
  auStack_4c0[0x15] = '\0';
  auStack_4c0[0x16] = '\0';
  auStack_4c0[0x17] = '\0';
  auStack_4e0._24_8_ = 0;
  auStack_4c0._0_8_ = (char *)0x0;
  auStack_4e0[8] = '\0';
  auStack_4e0[9] = '\0';
  auStack_4e0[10] = '\0';
  auStack_4e0[0xb] = '\0';
  auStack_4e0[0xc] = '\0';
  auStack_4e0[0xd] = '\0';
  auStack_4e0[0xe] = '\0';
  auStack_4e0[0xf] = '\0';
  auStack_4e0[0x10] = '\0';
  auStack_4e0[0x11] = '\0';
  auStack_4e0[0x12] = '\0';
  auStack_4e0[0x13] = '\0';
  auStack_4e0[0x14] = '\0';
  auStack_4e0[0x15] = '\0';
  auStack_4e0[0x16] = '\0';
  auStack_4e0[0x17] = '\0';
  local_4e8[0] = '\0';
  local_4e8[1] = '\0';
  local_4e8[2] = '\0';
  local_4e8[3] = '\0';
  local_4e8[4] = '\0';
  local_4e8[5] = '\0';
  local_4e8[6] = '\0';
  local_4e8[7] = '\0';
  auStack_4e0._0_8_ = (char *)0x0;
  local_508._16_4_ = 0;
  local_508._20_4_ = 0;
  local_508._24_8_ = 0;
  local_508._0_8_ = (char *)0x0;
  local_508._8_4_ = 0;
  local_508._12_4_ = 0;
  auStack_4c0._24_8_ = 0;
  CSHA256::CSHA256((CSHA256 *)local_508);
  uVar5 = local_8c - 0x1d;
  data = local_a8.indirect_contents.indirect;
  if (local_8c < 0x1d) {
    uVar5 = local_8c;
    data = &local_a8;
  }
  CSHA256::Write((CSHA256 *)local_508,(uchar *)data,(ulong)uVar5);
  output_00.m_size = 0x14;
  output_00.m_data = local_c8;
  CHash160::Finalize((CHash160 *)local_508,output_00);
  local_508._16_4_ = 0;
  local_508._20_4_ = 0;
  local_508._24_8_ = 0;
  local_508._0_8_ = (char *)0x0;
  local_508._8_4_ = 0;
  local_508._12_4_ = 0;
  local_178.super_SigningProvider._vptr_SigningProvider._0_1_ = 0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_508,(iterator)local_508,
             (uchar *)&local_178);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_178,local_c8,
             local_c8 + 0x14,&local_589);
  ppVar3 = &CScript::operator<<((CScript *)local_508,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178)
            ->super_CScriptBase;
  uVar5 = ppVar3->_size;
  uVar1 = uVar5 - 0x1d;
  if (uVar5 < 0x1d) {
    uVar1 = uVar5;
  }
  ppVar7 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar3->_union).indirect_contents.indirect;
  if (uVar5 < 0x1d) {
    ppVar7 = ppVar3;
  }
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = 0x87;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar3,(uchar *)((long)&ppVar7->_union + (long)(int)uVar1),(uchar *)&local_578);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_e8.indirect_contents,ppVar3)
  ;
  if (local_178.super_SigningProvider._vptr_SigningProvider != (_func_int **)0x0) {
    operator_delete(local_178.super_SigningProvider._vptr_SigningProvider,
                    CONCAT44(local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                             local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                            ) - (long)local_178.super_SigningProvider._vptr_SigningProvider);
  }
  if (0x1c < (uint)local_508._28_4_) {
    free((void *)local_508._0_8_);
    local_508._0_8_ = (char *)0x0;
  }
  local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_178.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_013e4e20;
  local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_178.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  local_178.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  local_178.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  local_178.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  local_178.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_178.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FillableSigningProvider::AddCScript(&local_178,(CScript *)&local_a8.indirect_contents);
  FillableSigningProvider::AddKeyPubKey(&local_178,(CKey *)local_588,&local_69);
  local_508._0_8_ = local_508._0_8_ & 0xffffffffffff0000;
  local_440._M_color = _S_red;
  local_440._M_parent = (_Base_ptr)0x0;
  memset(local_508 + 8,0,0xb8);
  local_420 = 0;
  local_3b0 = false;
  local_3a0._M_left = &local_3a0;
  local_3a0._M_color = _S_red;
  local_3a0._M_parent = (_Base_ptr)0x0;
  local_380 = 0;
  local_370._M_left = &local_370;
  local_370._M_color = _S_red;
  local_370._M_parent = (_Base_ptr)0x0;
  local_328._M_left = &local_328;
  local_328._M_color = _S_red;
  local_328._M_parent = (_Base_ptr)0x0;
  local_350 = 0;
  puStack_348 = (pointer)0x0;
  local_340 = (pointer)0x0;
  puStack_338 = (pointer)0x0;
  local_308 = 0;
  local_2f8._M_left = &local_2f8;
  local_2f8._M_color = _S_red;
  local_2f8._M_parent = (_Base_ptr)0x0;
  local_2d8 = 0;
  local_2c8._M_left = &local_2c8;
  local_2c8._M_color = _S_red;
  local_2c8._M_parent = (_Base_ptr)0x0;
  local_230._M_left = &local_230;
  local_230._M_color = _S_red;
  local_230._M_parent = (_Base_ptr)0x0;
  auStack_270[0x28] = '\0';
  auStack_270[0x29] = '\0';
  auStack_270[0x2a] = '\0';
  auStack_270[0x2b] = '\0';
  auStack_270[0x2c] = '\0';
  auStack_270[0x2d] = '\0';
  auStack_270[0x2e] = '\0';
  auStack_270[0x2f] = '\0';
  auStack_270[0x30] = '\0';
  auStack_270[0x31] = '\0';
  auStack_270[0x32] = '\0';
  auStack_270[0x33] = '\0';
  auStack_270[0x18] = '\0';
  auStack_270[0x19] = '\0';
  auStack_270[0x1a] = '\0';
  auStack_270[0x1b] = '\0';
  auStack_270[0x1c] = '\0';
  auStack_270[0x1d] = '\0';
  auStack_270[0x1e] = '\0';
  auStack_270[0x1f] = '\0';
  auStack_270[0x20] = '\0';
  auStack_270[0x21] = '\0';
  auStack_270[0x22] = '\0';
  auStack_270[0x23] = '\0';
  auStack_270[0x24] = '\0';
  auStack_270[0x25] = '\0';
  auStack_270[0x26] = '\0';
  auStack_270[0x27] = '\0';
  auStack_270[8] = '\0';
  auStack_270[9] = '\0';
  auStack_270[10] = '\0';
  auStack_270[0xb] = '\0';
  auStack_270[0xc] = '\0';
  auStack_270[0xd] = '\0';
  auStack_270[0xe] = '\0';
  auStack_270[0xf] = '\0';
  auStack_270[0x10] = '\0';
  auStack_270[0x11] = '\0';
  auStack_270[0x12] = '\0';
  auStack_270[0x13] = '\0';
  auStack_270[0x14] = '\0';
  auStack_270[0x15] = '\0';
  auStack_270[0x16] = '\0';
  auStack_270[0x17] = '\0';
  local_278 = (pointer)0x0;
  auStack_270[0] = '\0';
  auStack_270[1] = '\0';
  auStack_270[2] = '\0';
  auStack_270[3] = '\0';
  auStack_270[4] = '\0';
  auStack_270[5] = '\0';
  auStack_270[6] = '\0';
  auStack_270[7] = '\0';
  local_288 = (pointer)0x0;
  pCStack_280 = (pointer)0x0;
  local_298 = (pointer)0x0;
  pCStack_290 = (pointer)0x0;
  local_2a8 = 0;
  pCStack_2a0 = (pointer)0x0;
  local_210 = 0;
  local_200._M_left = &local_200;
  local_200._M_color = _S_red;
  local_200._M_parent = (_Base_ptr)0x0;
  local_1e0 = 0;
  local_1d0._M_left = &local_1d0;
  local_1d0._M_color = _S_red;
  local_1d0._M_parent = (_Base_ptr)0x0;
  local_1b0 = 0;
  local_1a0._M_left = &local_1a0;
  local_1a0._M_color = _S_red;
  local_1a0._M_parent = (_Base_ptr)0x0;
  local_180 = 0;
  if (use_max_sig) {
    ppBVar4 = &DUMMY_MAXIMUM_SIGNATURE_CREATOR;
  }
  else {
    ppBVar4 = &DUMMY_SIGNATURE_CREATOR;
  }
  local_440._M_left = &local_440;
  local_440._M_right = &local_440;
  local_3a0._M_right = local_3a0._M_left;
  local_370._M_right = local_370._M_left;
  local_328._M_right = local_328._M_left;
  local_2f8._M_right = local_2f8._M_left;
  local_2c8._M_right = local_2c8._M_left;
  local_230._M_right = local_230._M_left;
  local_200._M_right = local_200._M_left;
  local_1d0._M_right = local_1d0._M_left;
  local_1a0._M_right = local_1a0._M_left;
  bVar2 = ProduceSignature(&local_178.super_SigningProvider,*ppBVar4,
                           (CScript *)&local_e8.indirect_contents,(SignatureData *)local_508);
  if (!bVar2) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x300,"size_t wallet::wallet_tests::CalculateNestedKeyhashInputSize(bool)");
  }
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_578.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_578.prevout.n = 0xffffffff;
  local_578.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  local_578.scriptSig.super_CScriptBase._union._8_8_ = 0;
  local_578.scriptSig.super_CScriptBase._union._16_8_ = 0;
  local_578.scriptSig.super_CScriptBase._24_8_ = 0;
  local_578.scriptWitness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.scriptWitness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_578.scriptWitness.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_578.nSequence = 0xffffffff;
  UpdateInput(&local_578,(SignatureData *)local_508);
  sVar6 = GetVirtualTransactionInputSize(&local_578,0,0);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_578.scriptWitness.stack);
  if (0x1c < local_578.scriptSig.super_CScriptBase._size) {
    free(local_578.scriptSig.super_CScriptBase._union.indirect_contents.indirect);
    local_578.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  SignatureData::~SignatureData((SignatureData *)local_508);
  local_178.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_013e4e20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_178.mapScripts._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_178.mapKeys._M_t);
  if (0x1c < local_cc) {
    free(local_e8.indirect_contents.indirect);
    local_e8.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < local_8c) {
    free(local_a8.indirect_contents.indirect);
    local_a8.indirect_contents.indirect = (char *)0x0;
  }
  if (local_580._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_580,
               (array<unsigned_char,_32UL> *)
               local_580._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return sVar6;
}

Assistant:

static size_t CalculateNestedKeyhashInputSize(bool use_max_sig)
{
    // Generate ephemeral valid pubkey
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();

    // Generate pubkey hash
    uint160 key_hash(Hash160(pubkey));

    // Create inner-script to enter into keystore. Key hash can't be 0...
    CScript inner_script = CScript() << OP_0 << std::vector<unsigned char>(key_hash.begin(), key_hash.end());

    // Create outer P2SH script for the output
    uint160 script_id(Hash160(inner_script));
    CScript script_pubkey = CScript() << OP_HASH160 << std::vector<unsigned char>(script_id.begin(), script_id.end()) << OP_EQUAL;

    // Add inner-script to key store and key to watchonly
    FillableSigningProvider keystore;
    keystore.AddCScript(inner_script);
    keystore.AddKeyPubKey(key, pubkey);

    // Fill in dummy signatures for fee calculation.
    SignatureData sig_data;

    if (!ProduceSignature(keystore, use_max_sig ? DUMMY_MAXIMUM_SIGNATURE_CREATOR : DUMMY_SIGNATURE_CREATOR, script_pubkey, sig_data)) {
        // We're hand-feeding it correct arguments; shouldn't happen
        assert(false);
    }

    CTxIn tx_in;
    UpdateInput(tx_in, sig_data);
    return (size_t)GetVirtualTransactionInputSize(tx_in);
}